

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cc
# Opt level: O3

string * mem_string_abi_cxx11_
                   (string *__return_storage_ptr__,MemoryStatus *mem_status,MEMORY_MODE mode,
                   bool use_colors,bool use_powerline_left,bool use_powerline_right)

{
  uint *puVar1;
  ostream *poVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  char *pcVar4;
  undefined3 in_register_00000089;
  float fVar5;
  float fVar6;
  ostringstream oss;
  char local_1ad;
  undefined4 local_1ac;
  long local_1a8;
  undefined8 local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1ac = CONCAT31(in_register_00000089,use_powerline_right);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  *(undefined8 *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = 2;
  puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18));
  *puVar1 = *puVar1 | 0x84;
  uVar3 = (ulong)((mem_status->used_mem * 100.0) / mem_status->total_mem);
  if ((int)CONCAT71(in_register_00000009,use_colors) != 0) {
    if ((char)local_1ac == '\0') {
      if (use_powerline_left) {
        powerline((ostringstream *)&local_1a8,mem_lut[uVar3 & 0xffffffff],NONE,false);
        local_1ad = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_1ad,1);
      }
      else {
        powerline((ostringstream *)&local_1a8,mem_lut[uVar3 & 0xffffffff],NONE,false);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"#[bg=default]",0xd);
      powerline((ostringstream *)&local_1a8,mem_lut[uVar3 & 0xffffffff],POWERLINE_RIGHT,false);
      local_1ad = ' ';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,&local_1ad,1);
    }
  }
  if (mode == MEMORY_MODE_USAGE_PERCENTAGE) {
    poVar2 = std::ostream::_M_insert<double>
                       ((double)((mem_status->used_mem / mem_status->total_mem) * 100.0));
    local_1ad = '%';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1ad,1);
    goto LAB_00102fae;
  }
  if (mode == MEMORY_MODE_FREE_MEMORY) {
    fVar5 = mem_status->total_mem - mem_status->used_mem;
    fVar6 = fVar5 * 0.0009765625;
    if (1.0 <= fVar6) {
      poVar2 = std::ostream::_M_insert<double>((double)fVar6);
      pcVar4 = "GB";
    }
    else {
      poVar2 = std::ostream::_M_insert<double>((double)fVar5);
      pcVar4 = "MB";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,2);
    goto LAB_00102fae;
  }
  if ((mem_status->used_mem <= 10000.0) || (mem_status->total_mem <= 10000.0)) {
    if ((mem_status->used_mem < 10000.0) && (10000.0 < mem_status->total_mem)) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"MB/",3);
      goto LAB_00102f41;
    }
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pcVar4 = "MB";
  }
  else {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
LAB_00102f41:
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pcVar4 = "GB";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,2);
LAB_00102fae:
  if (use_colors) {
    if (use_powerline_left) {
      powerline((ostringstream *)&local_1a8,mem_lut[uVar3 & 0xffffffff],POWERLINE_LEFT,true);
    }
    else if ((char)local_1ac == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"#[fg=default,bg=default]",0x18);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string mem_string( const MemoryStatus & mem_status,
  MEMORY_MODE mode,
  bool use_colors,
  bool use_powerline_left,
  bool use_powerline_right )
{
  std::ostringstream oss;
  // Change the percision for floats, for a pretty output
  oss.precision( 2 );
  oss.setf( std::ios::fixed | std::ios::right );

  unsigned int color = static_cast< unsigned int >((100 * mem_status.used_mem) / mem_status.total_mem);
  if( use_colors )
  {
    if( use_powerline_right )
    {
      oss << "#[bg=default]";
      powerline( oss, mem_lut[color], POWERLINE_RIGHT );
      oss << ' ';
    }
    else if( use_powerline_left )
    {
      //powerline( oss, mem_lut[color], POWERLINE_LEFT );
      // We do not know how to invert the default background color
      powerline( oss, mem_lut[color], NONE );
      oss << ' ';
    }
    else
    {
      powerline( oss, mem_lut[color], NONE );
    }
  }

  switch( mode )
  {
  case MEMORY_MODE_FREE_MEMORY: // Show free memory in MB or GB
    {
    const float free_mem = mem_status.total_mem - mem_status.used_mem;
    const float free_mem_in_gigabytes = convert_unit( free_mem, GIGABYTES, MEGABYTES );

    // if free memory is less than 1 GB, use MB instead
    if(  free_mem_in_gigabytes < 1.0f )
    {
      oss << free_mem << "MB";
    }
    else
    {
      oss << free_mem_in_gigabytes << "GB";
    }
    break;
    }
  case MEMORY_MODE_USAGE_PERCENTAGE:
    {
    // Calculate the percentage of used memory
    const float percentage_mem = mem_status.used_mem /
      static_cast<float>( mem_status.total_mem ) * 100.0;

    oss << percentage_mem << '%';
    break;
    }
  default: // Default mode, just show the used/total memory in MB
    if(mem_status.used_mem>10000 && mem_status.total_mem>10000)
      oss<<static_cast<unsigned int>(mem_status.used_mem/1024)<<"/"<<static_cast<unsigned int>(mem_status.total_mem/1024)<<"GB";
    else if(mem_status.used_mem<10000 && mem_status.total_mem>10000)
      oss<<static_cast<unsigned int>(mem_status.used_mem)<<"MB/"<<static_cast<unsigned int>(mem_status.total_mem/1024)<<"GB";
    else
      oss<<static_cast<unsigned int>(mem_status.used_mem)<<"/"<<static_cast<unsigned int>(mem_status.total_mem)<<"MB";
  }

  if( use_colors )
  {
    if( use_powerline_left )
    {
      powerline( oss, mem_lut[color], POWERLINE_LEFT, true );
    }
    else if( !use_powerline_right )
    {
      oss << "#[fg=default,bg=default]";
    }
  }

  return oss.str();
}